

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexed_vector.cc
# Opt level: O2

void __thiscall ipx::IndexedVector::set_to_zero(IndexedVector *this)

{
  double *pdVar1;
  pointer piVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  double local_10;
  
  bVar3 = sparse(this);
  if (bVar3) {
    pdVar1 = (this->elements_)._M_data;
    piVar2 = (this->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = 0;
    uVar4 = (ulong)(uint)this->nnz_;
    if (this->nnz_ < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar1[piVar2[uVar5]] = 0.0;
    }
  }
  else {
    local_10 = 0.0;
    std::valarray<double>::operator=(&this->elements_,&local_10);
  }
  this->nnz_ = 0;
  return;
}

Assistant:

void IndexedVector::set_to_zero() {
    if (sparse()) {
        for (Int p = 0; p < nnz_; p++)
            elements_[pattern_[p]] = 0.0;
    } else {
        elements_ = 0.0;
    }
    nnz_ = 0;
}